

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O0

void __thiscall
wasm::Memory64Lowering::visitDataSegment(Memory64Lowering *this,DataSegment *segment)

{
  Name base;
  bool bVar1;
  int64_t iVar2;
  GlobalGet *pGVar3;
  Module *this_00;
  Global *this_01;
  Const *pCVar4;
  Name name;
  Type local_158;
  Type local_150;
  char *local_148;
  Type TStack_140;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_138;
  Builder local_130;
  Builder builder;
  Global *local_100;
  Global *memoryBase32;
  ImportInfo info;
  Global *g;
  Module *module;
  GlobalGet *get;
  Literal local_38;
  Const *local_20;
  Const *c;
  DataSegment *segment_local;
  Memory64Lowering *this_local;
  
  if ((segment->isPassive & 1U) == 0) {
    c = (Const *)segment;
    segment_local = (DataSegment *)this;
    local_20 = Expression::dynCast<wasm::Const>(segment->offset);
    if (local_20 == (Const *)0x0) {
      pGVar3 = Expression::dynCast<wasm::GlobalGet>
                         ((Expression *)
                          c[1].super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.
                          type.id);
      if (pGVar3 != (GlobalGet *)0x0) {
        this_00 = Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>::
                  getModule(&(this->
                             super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                             ).
                             super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                             .
                             super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                           );
        info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(pGVar3->name).super_IString.str._M_len
        ;
        this_01 = Module::getGlobal(this_00,(Name)(pGVar3->name).super_IString.str);
        bVar1 = Importable::imported(&this_01->super_Importable);
        if ((bVar1) &&
           (bVar1 = IString::operator==(&(this_01->super_Importable).base.super_IString,
                                        (IString *)MEMORY_BASE), bVar1)) {
          ImportInfo::ImportInfo((ImportInfo *)&memoryBase32,this_00);
          builder.wasm = (Module *)MEMORY_BASE32._0_8_;
          base.super_IString.str._M_str = (char *)MEMORY_BASE32._8_8_;
          base.super_IString.str._M_len = MEMORY_BASE32._0_8_;
          local_100 = ImportInfo::getImportedGlobal
                                ((ImportInfo *)&memoryBase32,
                                 (Name)(this_01->super_Importable).module.super_IString.str,base);
          if (local_100 == (Global *)0x0) {
            Builder::Builder(&local_130,this_00);
            local_148 = (char *)MEMORY_BASE32._0_8_;
            TStack_140.id = MEMORY_BASE32._8_8_;
            wasm::Type::Type(&local_150,i32);
            pCVar4 = Builder::makeConst<int>(&local_130,0);
            name.super_IString.str._M_str = local_148;
            name.super_IString.str._M_len = (size_t)&local_138;
            Builder::makeGlobal(name,TStack_140,(Expression *)local_150.id,(Mutability)pCVar4);
            local_100 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::release
                                  (&local_138);
            std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                      (&local_138);
            wasm::Name::operator=
                      (&(local_100->super_Importable).module,&(this_01->super_Importable).module);
            wasm::Name::operator=(&(local_100->super_Importable).base,(Name *)MEMORY_BASE32);
            Module::addGlobal(this_00,local_100);
          }
          if (local_100 == (Global *)0x0) {
            __assert_fail("memoryBase32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Memory64Lowering.cpp"
                          ,0x9b,"void wasm::Memory64Lowering::visitDataSegment(DataSegment *)");
          }
          wasm::Type::Type(&local_158,i32);
          (pGVar3->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id =
               local_158.id;
          wasm::Name::operator=(&pGVar3->name,(Name *)local_100);
          ImportInfo::~ImportInfo((ImportInfo *)&memoryBase32);
        }
      }
    }
    else {
      iVar2 = wasm::Literal::geti64(&local_20->value);
      wasm::Literal::Literal(&local_38,(uint32_t)iVar2);
      wasm::Literal::operator=(&local_20->value,&local_38);
      wasm::Literal::~Literal(&local_38);
      wasm::Type::Type((Type *)&get,i32);
      (local_20->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id =
           (uintptr_t)get;
    }
  }
  return;
}

Assistant:

void visitDataSegment(DataSegment* segment) {
    if (!segment->isPassive) {
      if (auto* c = segment->offset->dynCast<Const>()) {
        c->value = Literal(static_cast<uint32_t>(c->value.geti64()));
        c->type = Type::i32;
      } else if (auto* get = segment->offset->dynCast<GlobalGet>()) {
        auto& module = *getModule();
        auto* g = module.getGlobal(get->name);
        if (g->imported() && g->base == MEMORY_BASE) {
          ImportInfo info(module);
          auto* memoryBase32 = info.getImportedGlobal(g->module, MEMORY_BASE32);
          if (!memoryBase32) {
            Builder builder(module);
            memoryBase32 = builder
                             .makeGlobal(MEMORY_BASE32,
                                         Type::i32,
                                         builder.makeConst(int32_t(0)),
                                         Builder::Immutable)
                             .release();
            memoryBase32->module = g->module;
            memoryBase32->base = MEMORY_BASE32;
            module.addGlobal(memoryBase32);
          }
          // Use this alternative import when initializing the segment.
          assert(memoryBase32);
          get->type = Type::i32;
          get->name = memoryBase32->name;
        }
      }
    }
  }